

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O0

int checkday(char *check,size_t len)

{
  int iVar1;
  size_t sVar2;
  size_t ilen;
  char **what;
  int i;
  size_t len_local;
  char *check_local;
  
  if (len < 4) {
    if (len != 3) {
      return -1;
    }
    ilen = (size_t)Curl_wkday;
  }
  else {
    ilen = (size_t)weekday;
  }
  what._4_4_ = 0;
  while( true ) {
    if (6 < what._4_4_) {
      return -1;
    }
    sVar2 = strlen(*(char **)ilen);
    if ((sVar2 == len) && (iVar1 = curl_strnequal(check,*(char **)ilen,len), iVar1 != 0)) break;
    ilen = ilen + 8;
    what._4_4_ = what._4_4_ + 1;
  }
  return what._4_4_;
}

Assistant:

static int checkday(const char *check, size_t len)
{
  int i;
  const char * const *what;
  if(len > 3)
    what = &weekday[0];
  else if(len == 3)
    what = &Curl_wkday[0];
  else
    return -1; /* too short */
  for(i = 0; i < 7; i++) {
    size_t ilen = strlen(what[0]);
    if((ilen == len) &&
       strncasecompare(check, what[0], len))
      return i;
    what++;
  }
  return -1;
}